

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

Vec_Int_t * Gia_ManSimSimulateOne(Gia_Man_t *p,Vec_Int_t *vPat)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong local_40;
  
  if (vPat->nSize % (p->vCis->nSize - p->nRegs) != 0) {
    __assert_fail("Vec_IntSize(vPat) % Gia_ManPiNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,0x2c4,"Vec_Int_t *Gia_ManSimSimulateOne(Gia_Man_t *, Vec_Int_t *)");
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffffffffff;
  iVar9 = p->nRegs;
  if (0 < iVar9) {
    iVar5 = 0;
    do {
      iVar6 = p->vCis->nSize;
      uVar12 = (iVar6 - iVar9) + iVar5;
      if (((int)uVar12 < 0) || (iVar6 <= (int)uVar12)) {
LAB_00718cff:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = p->vCis->pArray[uVar12];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_00718ce0:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar9;
      *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffffffffff;
      iVar5 = iVar5 + 1;
      iVar9 = p->nRegs;
    } while (iVar5 < iVar9);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(4000);
  p_00->pArray = piVar7;
  iVar9 = vPat->nSize;
  if (iVar9 / (p->vCis->nSize - p->nRegs) < 1) {
    local_40._0_4_ = 0;
  }
  else {
    iVar5 = 0;
    local_40 = 0;
    do {
      pVVar8 = p->vCis;
      uVar13 = (ulong)(uint)pVVar8->nSize;
      if (p->nRegs < pVVar8->nSize) {
        lVar10 = 0;
        do {
          if ((int)uVar13 <= lVar10) goto LAB_00718cff;
          iVar9 = pVVar8->pArray[lVar10];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00718ce0;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (((int)local_40 < 0) || (vPat->nSize <= (int)local_40 + (int)lVar10))
          goto LAB_00718cff;
          pGVar4 = p->pObjs + iVar9;
          *(ulong *)pGVar4 =
               *(ulong *)pGVar4 & 0xbfffffffffffffff |
               (ulong)(vPat->pArray[(local_40 & 0xffffffff) + lVar10] & 1) << 0x3e;
          lVar10 = lVar10 + 1;
          pVVar8 = p->vCis;
          uVar13 = (ulong)pVVar8->nSize;
        } while (lVar10 < (long)(uVar13 - (long)p->nRegs));
        local_40 = (local_40 & 0xffffffff) + lVar10;
      }
      if (0 < p->nObjs) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar13 = *(ulong *)(&pGVar4->field_0x0 + lVar10);
          if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
            *(ulong *)(&pGVar4->field_0x0 + lVar10) =
                 uVar13 & 0xbfffffff7fffffff |
                 ((ulong)(((uint)(uVar13 >> 0x3d) ^
                          (uint)((ulong)*(undefined8 *)
                                         ((long)pGVar4 +
                                         (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3 + lVar10)
                                >> 0x3e)) &
                         ((uint)((ulong)*(undefined8 *)
                                         ((long)pGVar4 +
                                         (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3 +
                                         lVar10) >> 0x3e) ^ (uint)(uVar13 >> 0x1d) & 7)) & 1) <<
                 0x3e;
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar11 < p->nObjs);
      }
      pVVar8 = p->vCos;
      if (0 < pVVar8->nSize) {
        lVar10 = 0;
        do {
          iVar9 = pVVar8->pArray[lVar10];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00718ce0;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar9;
          uVar13 = *(ulong *)pGVar4;
          *(ulong *)pGVar4 =
               uVar13 & 0xbfffffffffffffff |
               (uVar13 << 0x21 ^ *(ulong *)(pGVar4 + -(ulong)((uint)uVar13 & 0x1fffffff))) &
               0x4000000000000000;
          lVar10 = lVar10 + 1;
          pVVar8 = p->vCos;
        } while (lVar10 < pVVar8->nSize);
      }
      pVVar8 = p->vCos;
      uVar13 = (ulong)(uint)pVVar8->nSize;
      if (p->nRegs < pVVar8->nSize) {
        lVar10 = 0;
        do {
          if ((int)uVar13 <= lVar10) goto LAB_00718cff;
          iVar9 = pVVar8->pArray[lVar10];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00718ce0;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Vec_IntPush(p_00,(uint)((ulong)*(undefined8 *)(p->pObjs + iVar9) >> 0x3e) & 1);
          lVar10 = lVar10 + 1;
          pVVar8 = p->vCos;
          uVar13 = (ulong)pVVar8->nSize;
        } while (lVar10 < (long)(uVar13 - (long)p->nRegs));
      }
      iVar9 = p->nRegs;
      if (0 < iVar9) {
        iVar6 = 0;
        do {
          iVar2 = p->vCos->nSize;
          uVar12 = (iVar2 - iVar9) + iVar6;
          if (((int)uVar12 < 0) || (iVar2 <= (int)uVar12)) goto LAB_00718cff;
          iVar2 = p->vCos->pArray[uVar12];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00718ce0;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          iVar3 = p->vCis->nSize;
          uVar12 = (iVar3 - iVar9) + iVar6;
          if (((int)uVar12 < 0) || (iVar3 <= (int)uVar12)) goto LAB_00718cff;
          iVar9 = p->vCis->pArray[uVar12];
          lVar10 = (long)iVar9;
          if ((lVar10 < 0) || (p->nObjs <= iVar9)) goto LAB_00718ce0;
          *(ulong *)(pGVar4 + lVar10) =
               *(ulong *)(pGVar4 + lVar10) & 0xbfffffffffffffff |
               *(ulong *)(pGVar4 + iVar2) & 0x4000000000000000;
          iVar6 = iVar6 + 1;
          iVar9 = p->nRegs;
        } while (iVar6 < iVar9);
      }
      iVar5 = iVar5 + 1;
      iVar9 = vPat->nSize;
    } while (iVar5 < iVar9 / (p->vCis->nSize - p->nRegs));
  }
  if ((int)local_40 != iVar9) {
    __assert_fail("k == Vec_IntSize(vPat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,0x2d6,"Vec_Int_t *Gia_ManSimSimulateOne(Gia_Man_t *, Vec_Int_t *)");
  }
  if (0 < p->nObjs) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      puVar1 = (ulong *)(&p->pObjs->field_0x0 + lVar10);
      *puVar1 = *puVar1 & 0xbfffffffffffffff;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < p->nObjs);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSimSimulateOne( Gia_Man_t * p, Vec_Int_t * vPat )
{
    Vec_Int_t * vPatOut;
    Gia_Obj_t * pObj, * pObjRo;
    int i, k, f;
    assert( Vec_IntSize(vPat) % Gia_ManPiNum(p) == 0 );
    Gia_ManConst0(p)->fMark1 = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->fMark1 = 0;
    vPatOut = Vec_IntAlloc( 1000 );
    for ( k = f = 0; f < Vec_IntSize(vPat) / Gia_ManPiNum(p); f++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->fMark1 = Vec_IntEntry( vPat, k++ );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vPatOut, pObj->fMark1 );
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->fMark1 = pObj->fMark1;
    }
    assert( k == Vec_IntSize(vPat) );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark1 = 0;
    return vPatOut;
}